

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_based_vad.cc
# Opt level: O1

int __thiscall webrtc::PitchBasedVad::UpdatePrior(PitchBasedVad *this,double p)

{
  int iVar1;
  double dVar2;
  
  VadCircularBuffer::Insert
            ((this->circular_buffer_)._M_t.
             super___uniq_ptr_impl<webrtc::VadCircularBuffer,_std::default_delete<webrtc::VadCircularBuffer>_>
             ._M_t.
             super__Tuple_impl<0UL,_webrtc::VadCircularBuffer_*,_std::default_delete<webrtc::VadCircularBuffer>_>
             .super__Head_base<0UL,_webrtc::VadCircularBuffer_*,_false>._M_head_impl,p);
  iVar1 = VadCircularBuffer::RemoveTransient
                    ((this->circular_buffer_)._M_t.
                     super___uniq_ptr_impl<webrtc::VadCircularBuffer,_std::default_delete<webrtc::VadCircularBuffer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_webrtc::VadCircularBuffer_*,_std::default_delete<webrtc::VadCircularBuffer>_>
                     .super__Head_base<0UL,_webrtc::VadCircularBuffer_*,_false>._M_head_impl,7,0.2);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    dVar2 = VadCircularBuffer::Mean
                      ((this->circular_buffer_)._M_t.
                       super___uniq_ptr_impl<webrtc::VadCircularBuffer,_std::default_delete<webrtc::VadCircularBuffer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_webrtc::VadCircularBuffer_*,_std::default_delete<webrtc::VadCircularBuffer>_>
                       .super__Head_base<0UL,_webrtc::VadCircularBuffer_*,_false>._M_head_impl);
    this->p_prior_ = dVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int PitchBasedVad::UpdatePrior(double p) {
  circular_buffer_->Insert(p);
  if (circular_buffer_->RemoveTransient(kTransientWidthThreshold,
                                        kLowProbabilityThreshold) < 0)
    return -1;
  p_prior_ = circular_buffer_->Mean();
  return 0;
}